

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O2

HTS_Boolean HTS_strequal(char *s1,char *s2)

{
  HTS_Boolean HVar1;
  int iVar2;
  
  HVar1 = '\x01';
  if (s1 != (char *)0x0 || s2 != (char *)0x0) {
    if (s1 != (char *)0x0 && s2 != (char *)0x0) {
      iVar2 = strcmp(s1,s2);
      return iVar2 == 0;
    }
    HVar1 = '\0';
  }
  return HVar1;
}

Assistant:

static HTS_Boolean HTS_strequal(const char *s1, const char *s2)
{
   if (s1 == NULL && s2 == NULL)
      return TRUE;
   else if (s1 == NULL || s2 == NULL)
      return FALSE;
   else
      return strcmp(s1, s2) == 0 ? TRUE : FALSE;
}